

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_dump.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  FILE *pFVar4;
  size_t sVar5;
  ulong uVar6;
  undefined8 uVar7;
  DIR *pDVar8;
  dirent *pdVar9;
  long *__ptr;
  void *pvVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  bool bVar19;
  opj_image_t *image;
  opj_codestream_index_t *cstr_index;
  opj_codestream_info_v2_t *cstr_info;
  char infilename [4096];
  opj_dparameters_t parameters;
  opj_option_t long_option [1];
  long *local_50c0;
  FILE *local_50a8;
  int local_509c;
  undefined8 local_5098;
  undefined8 local_5090;
  undefined8 local_5088;
  ulong local_5080;
  undefined8 local_5078;
  int local_5070;
  undefined1 local_4074 [8];
  char local_406c [4096];
  char local_306c [4096];
  uint local_206c;
  undefined4 local_2054;
  byte local_203c;
  undefined8 local_2038;
  undefined1 local_2030;
  opj_option_t local_1038 [128];
  
  local_5098 = 0;
  local_5088 = 0;
  local_50c0 = (long *)0x0;
  local_5090 = 0;
  opj_set_default_decoder_parameters(local_4074);
  local_1038[0].flag = (int *)0x0;
  local_1038[0].val = 0x79;
  local_1038[0]._28_4_ = 0;
  local_1038[0].name = "ImgDir";
  local_1038[0].has_arg = 1;
  local_1038[0]._12_4_ = 0;
  local_2038 = 0x76683a663a6f3a69;
  local_2030 = 0;
  local_509c = 0x13;
  bVar1 = true;
LAB_00105c01:
  while (iVar2 = opj_getopt_long(argc,argv,(char *)&local_2038,local_1038,0x20), pFVar4 = _stdout,
        pcVar14 = opj_optarg, 0x75 < iVar2) {
    if (iVar2 == 0x76) {
      local_2054 = 1;
    }
    else {
      if (iVar2 != 0x79) goto switchD_00105c3b_caseD_67;
      sVar5 = strlen(opj_optarg);
      local_50c0 = (long *)malloc(sVar5 + 1);
      if (local_50c0 == (long *)0x0) {
        bVar19 = true;
        goto LAB_0010609d;
      }
      strcpy((char *)local_50c0,pcVar14);
      bVar1 = false;
    }
  }
  switch(iVar2) {
  case 0x66:
    local_509c = atoi(opj_optarg);
    goto LAB_00105c01;
  case 0x68:
    uVar7 = opj_version();
    fprintf(pFVar4,
            "\nThis is the opj_dump utility from the OpenJPEG project.\nIt dumps JPEG 2000 codestream info to stdout or a given file.\nIt has been compiled against openjp2 library v%s.\n\n"
            ,uVar7);
    fwrite("Parameters:\n",0xc,1,_stdout);
    fwrite("-----------\n",0xc,1,_stdout);
    fputc(10,_stdout);
    fwrite("  -ImgDir <directory>\n",0x16,1,_stdout);
    fwrite("\tImage file Directory path \n",0x1c,1,_stdout);
    fwrite("  -i <compressed file>\n",0x17,1,_stdout);
    fwrite("    REQUIRED only if an Input image directory not specified\n",0x3c,1,_stdout);
    fwrite("    Currently accepts J2K-files, JP2-files and JPT-files. The file type\n",0x48,1,
           _stdout);
    fwrite("    is identified based on its suffix.\n",0x27,1,_stdout);
    fwrite("  -o <output file>\n",0x13,1,_stdout);
    fwrite("    OPTIONAL\n",0xd,1,_stdout);
    fwrite("    Output file where file info will be dump.\n",0x2e,1,_stdout);
    fwrite("    By default it will be in the stdout.\n",0x29,1,_stdout);
    fwrite("  -v ",5,1,_stdout);
    fwrite("    OPTIONAL\n",0xd,1,_stdout);
    fwrite("    Enable informative messages\n",0x20,1,_stdout);
    fwrite("    By default verbose mode is off.\n",0x24,1,_stdout);
    fputc(10,_stdout);
    goto LAB_00106078;
  case 0x69:
    pFVar4 = fopen(opj_optarg,"rb");
    uVar16 = 0xffffffff;
    if (pFVar4 != (FILE *)0x0) {
      local_5070 = 0;
      local_5078 = 0;
      sVar5 = fread(&local_5078,1,0xc,pFVar4);
      fclose(pFVar4);
      if (sVar5 == 0xc) {
        uVar3 = get_file_format(pcVar14);
        uVar16 = 2;
        if (uVar3 != 2) {
          uVar15 = 1;
          if ((local_5070 != 0xa870a0d || local_5078 != 0x2020506a0c000000) &&
             ((int)local_5078 != 0xa870a0d)) {
            uVar16 = 0xffffffff;
            if ((int)local_5078 != 0x51ff4fff) goto LAB_00105dec;
            uVar15 = 0;
          }
          uVar16 = uVar3;
          if (uVar15 != uVar3) {
            main_cold_2();
            uVar16 = uVar15;
          }
        }
      }
    }
LAB_00105dec:
    local_206c = uVar16;
    if (2 < uVar16) {
      fprintf(_stderr,
              "[ERROR] Unknown input file format: %s \n        Known file formats are *.j2k, *.jp2, *.jpc or *.jpt\n"
              ,pcVar14);
      bVar19 = true;
      goto LAB_0010609d;
    }
    if (pcVar14 == (char *)0x0) {
      local_406c[0] = '\0';
    }
    else {
      if (*pcVar14 == '\0') {
        uVar17 = 0;
      }
      else {
        uVar6 = 0;
        do {
          uVar17 = uVar6 + 1;
          if (pcVar14[uVar6 + 1] == '\0') break;
          bVar19 = uVar6 < 0xfff;
          uVar6 = uVar17;
        } while (bVar19);
      }
      if (uVar17 < 0x1000) {
        memcpy(local_406c,pcVar14,uVar17);
        local_406c[uVar17] = '\0';
        goto LAB_00105c01;
      }
    }
    main_cold_3();
    goto LAB_00106078;
  case 0x6f:
    goto switchD_00105c3b_caseD_6f;
  default:
    if (iVar2 == -1) {
      if (!bVar1) {
        if (local_406c[0] == '\0') {
          main_cold_5();
        }
        else {
          main_cold_4();
        }
        goto LAB_00106078;
      }
      if (local_406c[0] != '\0') {
        bVar19 = false;
        goto LAB_0010609d;
      }
      main_cold_6();
      goto LAB_00106078;
    }
  case 0x67:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
switchD_00105c3b_caseD_67:
    main_cold_11();
    goto LAB_00105c01;
  }
code_r0x00105d78:
  memcpy(local_306c,opj_optarg,uVar17);
  local_306c[uVar17] = '\0';
  goto LAB_00105c01;
switchD_00105c3b_caseD_6f:
  if (opj_optarg == (char *)0x0) {
    local_306c[0] = '\0';
  }
  else {
    if (*opj_optarg == '\0') {
      uVar17 = 0;
    }
    else {
      uVar6 = 0;
      do {
        uVar17 = uVar6 + 1;
        if (opj_optarg[uVar6 + 1] == '\0') break;
        bVar19 = uVar6 < 0xfff;
        uVar6 = uVar17;
      } while (bVar19);
    }
    if (uVar17 < 0x1000) goto code_r0x00105d78;
  }
  main_cold_1();
LAB_00106078:
  bVar19 = true;
LAB_0010609d:
  if (bVar19) {
    if (local_50c0 == (long *)0x0) {
      return 1;
    }
    goto LAB_00106670;
  }
  if (bVar1) {
    uVar16 = 1;
    __ptr = (long *)0x0;
LAB_00106223:
    if (local_306c[0] == '\0') {
      local_50a8 = _stdout;
LAB_00106275:
      if (0 < (int)uVar16) {
        local_5080 = (ulong)uVar16;
        uVar17 = 0;
        do {
          fputc(10,_stderr);
          if (bVar1) {
LAB_001062c9:
            lVar11 = opj_stream_create_default_file_stream(local_406c,1);
            if (lVar11 == 0) {
              fprintf(_stderr,"ERROR -> failed to create the stream from the file %s\n",local_406c);
              goto LAB_00106646;
            }
            if ((ulong)local_206c < 3) {
              lVar12 = opj_create_decompress(*(undefined4 *)(&DAT_001120b8 + (ulong)local_206c * 4))
              ;
              opj_set_info_handler(lVar12,info_callback,0);
              opj_set_warning_handler(lVar12,warning_callback,0);
              opj_set_error_handler(lVar12,error_callback,0);
              local_203c = local_203c | 2;
              iVar2 = opj_setup_decoder(lVar12,local_4074);
              if (iVar2 == 0) {
                main_cold_10();
                goto LAB_00106646;
              }
              iVar2 = opj_read_header(lVar11,lVar12,&local_5098);
              if (iVar2 == 0) {
                main_cold_9();
                goto LAB_00106646;
              }
              opj_dump_codec(lVar12,local_509c,local_50a8);
              local_5088 = opj_get_cstr_info(lVar12);
              local_5090 = opj_get_cstr_index(lVar12);
              opj_stream_destroy(lVar11);
              if (lVar12 != 0) {
                opj_destroy_codec(lVar12);
              }
              opj_image_destroy(local_5098);
              opj_destroy_cstr_index(&local_5090);
              opj_destroy_cstr_info(&local_5088);
            }
            else {
              main_cold_8();
            }
          }
          else {
            memset(&local_2038,0,0x1000);
            strcpy((char *)local_1038,*(char **)(__ptr[1] + uVar17 * 8));
            fprintf(_stderr,"File Number %d \"%s\"\n",uVar17 & 0xffffffff,local_1038);
            local_206c = get_file_format((char *)local_1038);
            if (local_206c != 0xffffffff) {
              sprintf((char *)&local_5078,"%s/%s",local_50c0,local_1038);
              if ((char)local_5078 == '\0') {
                uVar6 = 0;
              }
              else {
                uVar13 = 0;
                do {
                  uVar6 = uVar13 + 1;
                  if (*(char *)((long)&local_5078 + uVar13 + 1) == '\0') break;
                  bVar19 = uVar13 < 0xfff;
                  uVar13 = uVar6;
                } while (bVar19);
              }
              if (uVar6 < 0x1000) {
                memcpy(local_406c,&local_5078,uVar6);
                local_406c[uVar6] = '\0';
                strtok((char *)local_1038,".");
                pcVar14 = strtok((char *)0x0,".");
                while (pcVar14 != (char *)0x0) {
                  sprintf((char *)&local_2038,".%s",pcVar14);
                  pcVar14 = strtok((char *)0x0,".");
                }
                goto LAB_001062c9;
              }
            }
            fwrite("skipping file...\n",0x11,1,_stderr);
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != local_5080);
      }
      fclose(local_50a8);
      return 0;
    }
    local_50a8 = fopen(local_306c,"w");
    if (local_50a8 != (FILE *)0x0) goto LAB_00106275;
    fprintf(_stderr,"ERROR -> failed to open %s for writing\n",local_306c);
  }
  else {
    pDVar8 = opendir((char *)local_50c0);
    if (pDVar8 == (DIR *)0x0) {
      uVar16 = 0;
      fprintf(_stderr,"Could not open Folder %s\n",local_50c0);
    }
    else {
      pdVar9 = readdir(pDVar8);
      if (pdVar9 == (dirent *)0x0) {
        uVar16 = 0;
      }
      else {
        uVar16 = 0;
        do {
          iVar2 = strcmp(".",pdVar9->d_name);
          if ((iVar2 != 0) && (iVar2 = strcmp("..",pdVar9->d_name), iVar2 != 0)) {
            uVar16 = uVar16 + 1;
          }
          pdVar9 = readdir(pDVar8);
        } while (pdVar9 != (dirent *)0x0);
      }
      closedir(pDVar8);
    }
    __ptr = (long *)malloc(0x10);
    iVar2 = 1;
    if (__ptr == (long *)0x0) {
LAB_0010620a:
      iVar18 = 1;
    }
    else {
      pvVar10 = malloc((long)(int)uVar16 << 0xc);
      *__ptr = (long)pvVar10;
      if (pvVar10 == (void *)0x0) {
        free(__ptr);
        goto LAB_0010620a;
      }
      pvVar10 = malloc((long)(int)uVar16 << 3);
      __ptr[1] = (long)pvVar10;
      iVar18 = 2;
      iVar2 = 0;
      if (pvVar10 != (void *)0x0) {
        if (0 < (int)uVar16) {
          uVar17 = 0;
          do {
            *(ulong *)(__ptr[1] + uVar17 * 8) = uVar17 * 0x1000 + *__ptr;
            uVar17 = uVar17 + 1;
          } while (uVar17 != uVar16);
        }
        pDVar8 = opendir((char *)local_50c0);
        if (pDVar8 == (DIR *)0x0) {
          fprintf(_stderr,"Could not open Folder %s\n",local_50c0);
        }
        else {
          main_cold_7();
          iVar2 = 0;
          if (uVar16 == 0) {
            fwrite("Folder is empty\n",0x10,1,_stdout);
          }
          else {
            iVar18 = 0;
          }
        }
      }
    }
    if (iVar18 != 2) {
      if (iVar18 != 0) {
        return iVar2;
      }
      goto LAB_00106223;
    }
  }
LAB_00106646:
  local_50c0 = __ptr;
  if (local_50c0 == (long *)0x0) {
    return 1;
  }
  if ((void *)local_50c0[1] != (void *)0x0) {
    free((void *)local_50c0[1]);
  }
  if ((void *)*local_50c0 != (void *)0x0) {
    free((void *)*local_50c0);
  }
LAB_00106670:
  free(local_50c0);
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
    FILE *fout = NULL;

    opj_dparameters_t parameters;           /* Decompression parameters */
    opj_image_t* image = NULL;                  /* Image structure */
    opj_codec_t* l_codec = NULL;                /* Handle to a decompressor */
    opj_stream_t *l_stream = NULL;              /* Stream */
    opj_codestream_info_v2_t* cstr_info = NULL;
    opj_codestream_index_t* cstr_index = NULL;

    OPJ_INT32 num_images, imageno;
    img_fol_t img_fol;
    dircnt_t *dirptr = NULL;

    /* Set decoding parameters to default values */
    opj_set_default_decoder_parameters(&parameters);

    /* Initialize img_fol */
    memset(&img_fol, 0, sizeof(img_fol_t));
    img_fol.flag = OPJ_IMG_INFO | OPJ_J2K_MH_INFO | OPJ_J2K_MH_IND;

    /* Parse input and get user encoding parameters */
    if (parse_cmdline_decoder(argc, argv, &parameters, &img_fol) == 1) {
        if (img_fol.imgdirpath) {
            free(img_fol.imgdirpath);
        }

        return EXIT_FAILURE;
    }

    /* Initialize reading of directory */
    if (img_fol.set_imgdir == 1) {
        int it_image;
        num_images = get_num_images(img_fol.imgdirpath);

        dirptr = (dircnt_t*)malloc(sizeof(dircnt_t));
        if (!dirptr) {
            return EXIT_FAILURE;
        }
        dirptr->filename_buf = (char*)malloc((size_t)num_images * OPJ_PATH_LEN * sizeof(
                char)); /* Stores at max 10 image file names*/
        if (!dirptr->filename_buf) {
            free(dirptr);
            return EXIT_FAILURE;
        }
        dirptr->filename = (char**) malloc((size_t)num_images * sizeof(char*));

        if (!dirptr->filename) {
            goto fails;
        }

        for (it_image = 0; it_image < num_images; it_image++) {
            dirptr->filename[it_image] = dirptr->filename_buf + it_image * OPJ_PATH_LEN;
        }

        if (load_images(dirptr, img_fol.imgdirpath) == 1) {
            goto fails;
        }

        if (num_images == 0) {
            fprintf(stdout, "Folder is empty\n");
            goto fails;
        }
    } else {
        num_images = 1;
    }

    /* Try to open for writing the output file if necessary */
    if (parameters.outfile[0] != 0) {
        fout = fopen(parameters.outfile, "w");
        if (!fout) {
            fprintf(stderr, "ERROR -> failed to open %s for writing\n", parameters.outfile);
            goto fails;
        }
    } else {
        fout = stdout;
    }

    /* Read the header of each image one by one */
    for (imageno = 0; imageno < num_images ; imageno++) {

        fprintf(stderr, "\n");

        if (img_fol.set_imgdir == 1) {
            if (get_next_file(imageno, dirptr, &img_fol, &parameters)) {
                fprintf(stderr, "skipping file...\n");
                continue;
            }
        }

        /* Read the input file and put it in memory */
        /* ---------------------------------------- */

        l_stream = opj_stream_create_default_file_stream(parameters.infile, 1);
        if (!l_stream) {
            fprintf(stderr, "ERROR -> failed to create the stream from the file %s\n",
                    parameters.infile);
            goto fails;
        }

        /* Read the JPEG2000 stream */
        /* ------------------------ */

        switch (parameters.decod_format) {
        case J2K_CFMT: { /* JPEG-2000 codestream */
            /* Get a decoder handle */
            l_codec = opj_create_decompress(OPJ_CODEC_J2K);
            break;
        }
        case JP2_CFMT: { /* JPEG 2000 compressed image data */
            /* Get a decoder handle */
            l_codec = opj_create_decompress(OPJ_CODEC_JP2);
            break;
        }
        case JPT_CFMT: { /* JPEG 2000, JPIP */
            /* Get a decoder handle */
            l_codec = opj_create_decompress(OPJ_CODEC_JPT);
            break;
        }
        default:
            fprintf(stderr, "skipping file..\n");
            opj_stream_destroy(l_stream);
            continue;
        }

        /* catch events using our callbacks and give a local context */
        opj_set_info_handler(l_codec, info_callback, 00);
        opj_set_warning_handler(l_codec, warning_callback, 00);
        opj_set_error_handler(l_codec, error_callback, 00);

        parameters.flags |= OPJ_DPARAMETERS_DUMP_FLAG;

        /* Setup the decoder decoding parameters using user parameters */
        if (!opj_setup_decoder(l_codec, &parameters)) {
            fprintf(stderr, "ERROR -> opj_dump: failed to setup the decoder\n");
            opj_stream_destroy(l_stream);
            opj_destroy_codec(l_codec);
            fclose(fout);
            goto fails;
        }

        /* Read the main header of the codestream and if necessary the JP2 boxes*/
        if (! opj_read_header(l_stream, l_codec, &image)) {
            fprintf(stderr, "ERROR -> opj_dump: failed to read the header\n");
            opj_stream_destroy(l_stream);
            opj_destroy_codec(l_codec);
            opj_image_destroy(image);
            fclose(fout);
            goto fails;
        }

        opj_dump_codec(l_codec, img_fol.flag, fout);

        cstr_info = opj_get_cstr_info(l_codec);

        cstr_index = opj_get_cstr_index(l_codec);

        /* close the byte stream */
        opj_stream_destroy(l_stream);

        /* free remaining structures */
        if (l_codec) {
            opj_destroy_codec(l_codec);
        }

        /* destroy the image header */
        opj_image_destroy(image);

        /* destroy the codestream index */
        opj_destroy_cstr_index(&cstr_index);

        /* destroy the codestream info */
        opj_destroy_cstr_info(&cstr_info);

    }

    /* Close the output file */
    fclose(fout);

    return EXIT_SUCCESS;

fails:
    if (dirptr) {
        if (dirptr->filename) {
            free(dirptr->filename);
        }
        if (dirptr->filename_buf) {
            free(dirptr->filename_buf);
        }
        free(dirptr);
    }
    return EXIT_FAILURE;
}